

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::trimr(basic_substring<const_char> *this,char c)

{
  ulong uVar1;
  code *pcVar2;
  char *pcVar3;
  bool bVar4;
  error_flags eVar5;
  size_t sVar6;
  size_t len_;
  basic_substring<const_char> bVar7;
  basic_substring<const_char> local_20;
  
  pcVar3 = this->str;
  if (this->str != (char *)0x0 && this->len != 0) {
    sVar6 = last_not_of(this,c,0xffffffffffffffff);
    if (sVar6 != 0xffffffffffffffff) {
      len_ = sVar6 + 1;
      uVar1 = this->len;
      if (len_ != 0xffffffffffffffff && uVar1 <= sVar6) {
        eVar5 = get_error_flags();
        if ((eVar5 & 1) != 0) {
          bVar4 = is_debugger_attached();
          if (bVar4) {
            pcVar2 = (code *)swi(3);
            bVar7 = (basic_substring<const_char>)(*pcVar2)();
            return bVar7;
          }
        }
        handle_error(0x1e6196,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
      }
      if (len_ == 0xffffffffffffffff) {
        len_ = uVar1;
      }
      if (uVar1 < len_) {
        eVar5 = get_error_flags();
        if ((eVar5 & 1) != 0) {
          bVar4 = is_debugger_attached();
          if (bVar4) {
            pcVar2 = (code *)swi(3);
            bVar7 = (basic_substring<const_char>)(*pcVar2)();
            return bVar7;
          }
        }
        handle_error(0x1e6196,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
      }
      basic_substring(&local_20,this->str,len_);
      goto LAB_001927ad;
    }
    pcVar3 = this->str;
  }
  local_20.str = pcVar3;
  local_20.len = 0;
LAB_001927ad:
  bVar7.len = local_20.len;
  bVar7.str = local_20.str;
  return bVar7;
}

Assistant:

C4_ALWAYS_INLINE C4_PURE bool   empty()     const noexcept { return (len == 0 || str == nullptr); }